

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void mbc1_write_rom_shared
               (Emulator *e,u16 bank_lo_mask,int bank_hi_shift,MaskedAddress addr,u8 value)

{
  int iVar1;
  CartInfo *pCVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  undefined6 in_register_0000000a;
  uint uVar6;
  
  uVar5 = CONCAT62(in_register_0000000a,addr) >> 0xd & 0x7ffff;
  if (3 < (ushort)uVar5) {
    uVar4 = (uint)(e->state).memory_map_state.field_3.mbc1.byte_4000_5fff;
    uVar6 = uVar4 << ((byte)bank_hi_shift & 0x1f);
    iVar1 = *(int *)&(e->state).memory_map_state.field_3;
    uVar3 = uVar6 & 0xffff;
    if ((e->state).memory_map_state.field_3.mbc1.bank_mode != BANK_MODE_RAM) {
      uVar3 = 0;
      uVar4 = 0;
    }
    pCVar2 = e->cart_info;
    (e->state).memory_map_state.rom_base[0] =
         (s_rom_bank_count[pCVar2->rom_size] + 0x7fff & uVar3) << 0xe;
    (e->state).memory_map_state.rom_base[1] =
         (((uint)bank_lo_mask & iVar1 + (uint)((char)iVar1 == '\0') & 0xff | uVar6 & 0xffff) &
         s_rom_bank_count[pCVar2->rom_size] + 0x7fff) << 0xe;
    set_ext_ram_bank(e,(u8)uVar4);
    return;
  }
  (*(code *)(&DAT_00113e54 + *(int *)(&DAT_00113e54 + uVar5 * 4)))();
  return;
}

Assistant:

static void mbc1_write_rom_shared(Emulator* e, u16 bank_lo_mask,
                                  int bank_hi_shift, MaskedAddress addr,
                                  u8 value) {
  Mbc1* mbc1 = &MMAP_STATE.mbc1;
  switch (addr >> 13) {
    case 0: /* 0000-1fff */
      MMAP_STATE.ext_ram_enabled =
          (value & MBC_RAM_ENABLED_MASK) == MBC_RAM_ENABLED_VALUE;
      break;
    case 1: /* 2000-3fff */
      mbc1->byte_2000_3fff = value & MBC1_ROM_BANK_LO_SELECT_MASK;
      break;
    case 2: /* 4000-5fff */
      mbc1->byte_4000_5fff = value & MBC1_BANK_HI_SELECT_MASK;
      break;
    case 3: /* 6000-7fff */
      mbc1->bank_mode = (BankMode)(value & 1);
      break;
  }

  u16 hi_bank = mbc1->byte_4000_5fff << bank_hi_shift;

  u16 rom1_bank = mbc1->byte_2000_3fff;
  if (rom1_bank == 0) {
    rom1_bank++;
  }
  rom1_bank = (rom1_bank & bank_lo_mask) | hi_bank;

  u16 rom0_bank = 0;
  u8 ext_ram_bank = 0;
  if (mbc1->bank_mode == BANK_MODE_RAM) {
    rom0_bank |= hi_bank;
    ext_ram_bank = mbc1->byte_4000_5fff;
  }

  set_rom_bank(e, 0, rom0_bank);
  set_rom_bank(e, 1, rom1_bank);
  set_ext_ram_bank(e, ext_ram_bank);
}